

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O1

bool __thiscall embree::XML::hasChild(XML *this,string *childID)

{
  pointer pRVar1;
  pointer __s2;
  size_t sVar2;
  XML *pXVar3;
  size_t __n;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  pRVar1 = (this->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->children).
                super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1;
  bVar8 = lVar5 != 0;
  if (bVar8) {
    uVar6 = lVar5 >> 3;
    __s2 = (childID->_M_dataplus)._M_p;
    sVar2 = childID->_M_string_length;
    uVar7 = 1;
    do {
      pXVar3 = pRVar1[uVar7 - 1].ptr;
      __n = (pXVar3->name)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          return bVar8;
        }
        iVar4 = bcmp((pXVar3->name)._M_dataplus._M_p,__s2,__n);
        if (iVar4 == 0) {
          return bVar8;
        }
      }
      bVar8 = uVar7 < uVar6;
      lVar5 = uVar7 + (-(ulong)(uVar6 == 0) - uVar6);
      uVar7 = uVar7 + 1;
    } while (lVar5 != 0);
  }
  return bVar8;
}

Assistant:

bool hasChild(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return true;
      return false;
    }